

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb<int,_false,_5>_> __thiscall
immutable::rrb_pop<int,false,5>(immutable *this,ref<immutable::rrb<int,_false,_5>_> *in)

{
  int *piVar1;
  uint32_t uVar2;
  rrb<int,_false,_5> *prVar3;
  leaf_node<int,_false> *plVar4;
  tree_node<int,_false> *ptVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  undefined4 uVar8;
  undefined8 *puVar9;
  int *piVar10;
  ulong uVar11;
  uint uVar12;
  ref<immutable::rrb_details::leaf_node<int,_false>_> new_tail;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_30;
  
  prVar3 = in->ptr;
  if (prVar3 != (rrb<int,_false,_5> *)0x0) {
    if (prVar3->cnt == 1) {
      puVar9 = (undefined8 *)malloc(0x28);
      *puVar9 = 0;
      *(undefined4 *)(puVar9 + 1) = 0;
      puVar9[2] = 0;
      puVar9[3] = 0;
      local_30.ptr = (leaf_node<int,_false> *)malloc(0x18);
      (local_30.ptr)->child = (int *)0x0;
      (local_30.ptr)->type = LEAF_NODE;
      (local_30.ptr)->len = 0;
      (local_30.ptr)->_ref_count = 1;
      (local_30.ptr)->guid = 0;
      ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)(puVar9 + 2),&local_30);
      if ((local_30.ptr != (leaf_node<int,_false> *)0x0) &&
         (uVar2 = (local_30.ptr)->_ref_count, (local_30.ptr)->_ref_count = uVar2 - 1, uVar2 == 1)) {
        free(local_30.ptr);
      }
      *(undefined8 **)this = puVar9;
      *(undefined4 *)(puVar9 + 4) = 1;
    }
    else {
      piVar10 = (int *)malloc(0x28);
      uVar2 = prVar3->cnt;
      uVar6 = prVar3->shift;
      uVar7 = prVar3->tail_len;
      uVar8 = *(undefined4 *)&prVar3->field_0xc;
      ptVar5 = (prVar3->root).ptr;
      *(leaf_node<int,_false> **)(piVar10 + 4) = (prVar3->tail).ptr;
      *(tree_node<int,_false> **)(piVar10 + 6) = ptVar5;
      piVar10[0] = uVar2;
      piVar10[1] = uVar6;
      piVar10[2] = uVar7;
      piVar10[3] = uVar8;
      uVar8 = *(undefined4 *)&prVar3->field_0x24;
      piVar10[8] = prVar3->_ref_count;
      piVar10[9] = uVar8;
      if (*(long *)(piVar10 + 6) != 0) {
        piVar1 = (int *)(*(long *)(piVar10 + 6) + 8);
        *piVar1 = *piVar1 + 1;
      }
      if (*(long *)(piVar10 + 4) != 0) {
        piVar1 = (int *)(*(long *)(piVar10 + 4) + 8);
        *piVar1 = *piVar1 + 1;
      }
      piVar10[8] = 1;
      *piVar10 = *piVar10 + -1;
      *(int **)this = piVar10;
      if (prVar3->tail_len == 1) {
        rrb_details::promote_rightmost_leaf<int,false,5>
                  ((ref<immutable::rrb<int,_false,_5>_> *)this);
      }
      else {
        plVar4 = (prVar3->tail).ptr;
        uVar12 = plVar4->len - 1;
        local_30.ptr = (leaf_node<int,_false> *)calloc(1,(ulong)uVar12 * 4 + 0x18);
        (local_30.ptr)->len = uVar12;
        (local_30.ptr)->child = (int *)(local_30.ptr + 1);
        if (uVar12 != 0) {
          piVar1 = plVar4->child;
          uVar11 = 0;
          do {
            (&local_30.ptr[1].type)[uVar11] = piVar1[uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar12 != uVar11);
        }
        (local_30.ptr)->_ref_count = 1;
        piVar10[2] = piVar10[2] + -1;
        ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                  ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)(piVar10 + 4),&local_30);
        if ((local_30.ptr != (leaf_node<int,_false> *)0x0) &&
           (uVar2 = (local_30.ptr)->_ref_count, (local_30.ptr)->_ref_count = uVar2 - 1, uVar2 == 1))
        {
          free(local_30.ptr);
        }
      }
    }
    return (ref<immutable::rrb<int,_false,_5>_>)(rrb<int,_false,_5> *)this;
  }
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,
                "T *immutable::ref<immutable::rrb<int, false>>::operator->() const [T = immutable::rrb<int, false>]"
               );
}

Assistant:

T* ref<T>::operator->() const
      {
      assert(ptr != nullptr);
      return ptr;
      }